

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

Mat3x2 * __thiscall
vkt::sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,8>
          (Mat3x2 *__return_storage_ptr__,MatrixCaseUtils *this,ShaderEvalContext *evalCtx,
          int inputNdx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  tcu::Matrix<float,_2,_3>::Matrix(__return_storage_ptr__);
  fVar3 = *(float *)(this + 0x34);
  fVar1 = *(float *)(this + 0x40);
  fVar2 = *(float *)(this + 0x44);
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = *(float *)(this + 0x30);
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = fVar3;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = fVar1;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = fVar2;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[2].m_data = *(undefined8 *)(this + 0x50);
  return __return_storage_ptr__;
}

Assistant:

inline tcu::Mat3x2 getInputValue<INPUTTYPE_DYNAMIC, TYPE_FLOAT_MAT3X2> (const ShaderEvalContext& evalCtx, int inputNdx)
{
	DE_UNREF(inputNdx); // Not used.
	tcu::Mat3x2 m;
	m.setColumn(0, evalCtx.in[0].swizzle(0,1));
	m.setColumn(1, evalCtx.in[1].swizzle(0,1));
	m.setColumn(2, evalCtx.in[2].swizzle(0,1));
	return m;
}